

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

xmlXIncludeRefPtr xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  int local_2c;
  int i;
  xmlXIncludeRefPtr ref;
  xmlNodePtr node_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if (ctxt->fatalErr == 0) {
    if (ctxt->depth < 0x28) {
      for (local_2c = 0; local_2c < ctxt->incNr; local_2c = local_2c + 1) {
        if (ctxt->incTab[local_2c]->elem == node) {
          if (ctxt->incTab[local_2c]->expanding != 0) {
            xmlXIncludeErr(ctxt,node,0x640,"inclusion loop detected\n",(xmlChar *)0x0);
            return (xmlXIncludeRefPtr)0x0;
          }
          return ctxt->incTab[local_2c];
        }
      }
      ctxt_local = (xmlXIncludeCtxtPtr)xmlXIncludeAddNode(ctxt,node);
      if (ctxt_local == (xmlXIncludeCtxtPtr)0x0) {
        ctxt_local = (xmlXIncludeCtxtPtr)0x0;
      }
      else {
        *(int *)&ctxt_local->urlTab = 1;
        ctxt->depth = ctxt->depth + 1;
        xmlXIncludeLoadNode(ctxt,(xmlXIncludeRefPtr)ctxt_local);
        ctxt->depth = ctxt->depth + -1;
        *(int *)&ctxt_local->urlTab = 0;
      }
    }
    else {
      xmlXIncludeErr(ctxt,node,0x640,"maximum recursion depth exceeded\n",(xmlChar *)0x0);
      ctxt->fatalErr = 1;
      ctxt_local = (xmlXIncludeCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlXIncludeCtxtPtr)0x0;
  }
  return (xmlXIncludeRefPtr)ctxt_local;
}

Assistant:

static xmlXIncludeRefPtr
xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    xmlXIncludeRefPtr ref;
    int i;

    if (ctxt->fatalErr)
        return(NULL);
    if (ctxt->depth >= XINCLUDE_MAX_DEPTH) {
        xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                       "maximum recursion depth exceeded\n", NULL);
        ctxt->fatalErr = 1;
        return(NULL);
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /*
     * The XInclude engine offers no protection against exponential
     * expansion attacks similar to "billion laughs". Avoid timeouts by
     * limiting the total number of replacements when fuzzing.
     *
     * Unfortuately, a single XInclude can already result in quadratic
     * behavior:
     *
     *     <doc xmlns:xi="http://www.w3.org/2001/XInclude">
     *       <xi:include xpointer="xpointer(//e)"/>
     *       <e>
     *         <e>
     *           <e>
     *             <!-- more nested elements -->
     *           </e>
     *         </e>
     *       </e>
     *     </doc>
     */
    if (ctxt->incTotal >= 20)
        return(NULL);
    ctxt->incTotal++;
#endif

    for (i = 0; i < ctxt->incNr; i++) {
        if (ctxt->incTab[i]->elem == node) {
            if (ctxt->incTab[i]->expanding) {
                xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                               "inclusion loop detected\n", NULL);
                return(NULL);
            }
            return(ctxt->incTab[i]);
        }
    }

    ref = xmlXIncludeAddNode(ctxt, node);
    if (ref == NULL)
        return(NULL);
    ref->expanding = 1;
    ctxt->depth++;
    xmlXIncludeLoadNode(ctxt, ref);
    ctxt->depth--;
    ref->expanding = 0;

    return(ref);
}